

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

TSNode * ts_node__descendant_for_point_range
                   (TSNode *__return_storage_ptr__,TSNode self,TSPoint min,TSPoint max,
                   _Bool include_anonymous)

{
  TSNode self_00;
  TSNode self_01;
  bool bVar1;
  _Bool _Var2;
  TSPoint self_02;
  TSTree *parent;
  undefined1 local_98 [8];
  NodeChildIterator iterator;
  TSNode child;
  SubtreeHeapData *pSStack_40;
  _Bool did_descend;
  TSNode node;
  _Bool include_anonymous_local;
  TSPoint max_local;
  TSPoint min_local;
  
  pSStack_40 = (SubtreeHeapData *)self.context._0_8_;
  node.context[0] = self.context[2];
  node.context[1] = self.context[3];
  node.context._8_8_ = self.id;
  node.id = self.tree;
  *(undefined8 *)__return_storage_ptr__->context = self.context._0_8_;
  *(undefined8 *)(__return_storage_ptr__->context + 2) = self.context._8_8_;
  __return_storage_ptr__->id = self.id;
  __return_storage_ptr__->tree = self.tree;
  bVar1 = true;
  parent = (TSTree *)__return_storage_ptr__;
  node.tree._7_1_ = include_anonymous;
LAB_0012a8a6:
  do {
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    bVar1 = false;
    ts_node_iterate_children((NodeChildIterator *)local_98,(TSNode *)&stack0xffffffffffffffc0);
    do {
      _Var2 = ts_node_child_iterator_next
                        ((NodeChildIterator *)local_98,(TSNode *)&iterator.alias_sequence);
      if (!_Var2) goto LAB_0012a8a6;
      _Var2 = point_gt((TSPoint)iterator._12_8_,max);
    } while (!_Var2);
    self_01.context._8_8_ = child.context._8_8_;
    self_01.context._0_8_ = child.context._0_8_;
    self_01.id = child.id;
    self_01.tree = parent;
    self_02 = ts_node_start_point(self_01);
    _Var2 = point_gt(self_02,min);
    if (!_Var2) {
      pSStack_40 = (SubtreeHeapData *)iterator.alias_sequence;
      node.context._0_8_ = child.context._0_8_;
      node.context._8_8_ = child.context._8_8_;
      node.id = child.id;
      self_00.context._8_8_ = child.context._0_8_;
      self_00.context._0_8_ = iterator.alias_sequence;
      self_00.id = (void *)child.context._8_8_;
      self_00.tree = (TSTree *)child.id;
      _Var2 = ts_node__is_relevant(self_00,(_Bool)(node.tree._7_1_ & 1));
      if (_Var2) {
        ts_tree_set_cached_parent(self.tree,(TSNode *)&iterator.alias_sequence,(TSNode *)parent);
        (parent->root).ptr = pSStack_40;
        parent->language = (TSLanguage *)node.context._0_8_;
        parent->parent_cache = (ParentCacheEntry *)node.context._8_8_;
        *(void **)&parent->parent_cache_start = node.id;
      }
      bVar1 = true;
    }
  } while( true );
}

Assistant:

static inline TSNode ts_node__descendant_for_point_range(TSNode self, TSPoint min,
                                                         TSPoint max,
                                                         bool include_anonymous) {
  TSNode node = self;
  TSNode last_visible_node = self;

  bool did_descend = true;
  while (did_descend) {
    did_descend = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (point_gt(iterator.position.extent, max)) {
        if (point_gt(ts_node_start_point(child), min)) break;
        node = child;
        if (ts_node__is_relevant(node, include_anonymous)) {
          ts_tree_set_cached_parent(self.tree, &child, &last_visible_node);
          last_visible_node = node;
        }
        did_descend = true;
        break;
      }
    }
  }

  return last_visible_node;
}